

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O2

void __thiscall
VcdGen::Signal::value_at
          (Signal *this,
          vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
          *tick_data)

{
  _Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_38;
  
  get_tick_data();
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector((vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
            *)&local_38,tick_data);
  TickData::append(&get_tick_data::tick_data,
                   (vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
                    *)&local_38,this);
  std::
  _Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

void value_at( vector<tuple<uint64_t, uint32_t>> tick_data ){
        TickData& data = get_tick_data();
        data.append(tick_data, this);
    }